

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O3

void __thiscall
hungarian_algorithm::
HungarianSolver<boost::chrono::duration<long,boost::ratio<1l,1l>>,unsigned_long,std::less<boost::chrono::duration<long,boost::ratio<1l,1l>>>>
::
copyAndNormalizeCosts<boost::numeric::ublas::matrix<boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,boost::ratio<1l,1l>>,std::allocator<boost::chrono::duration<long,boost::ratio<1l,1l>>>>>>
          (HungarianSolver<boost::chrono::duration<long,boost::ratio<1l,1l>>,unsigned_long,std::less<boost::chrono::duration<long,boost::ratio<1l,1l>>>>
           *this,matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
                 *cost_function)

{
  long lVar1;
  ulong *puVar2;
  long lVar3;
  long lVar4;
  size_type i;
  const_reference pdVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  size_type sVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  size_type sVar19;
  long lVar20;
  size_type sVar21;
  ulong uVar22;
  long lVar23;
  
  uVar14 = *(ulong *)this;
  uVar17 = *(ulong *)(this + 8);
  if (uVar17 < uVar14) {
    if (uVar17 != 0) {
      uVar18 = 1;
      sVar11 = 0;
      do {
        if (uVar18 == 0) {
          uVar18 = 0;
        }
        else {
          lVar13 = *(long *)(this + 0xe0);
          sVar21 = 0;
          sVar19 = sVar11;
          do {
            i = boost::numeric::ublas::basic_row_major<unsigned_long,_long>::element
                          (sVar21,cost_function->size1_,sVar11,cost_function->size2_);
            pdVar5 = boost::numeric::ublas::
                     unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
                     ::operator[](&cost_function->data_,i);
            lVar20 = pdVar5->rep_;
            *(long *)(*(long *)(this + 0xe8) + sVar19 * 8) = lVar20;
            if (lVar20 < lVar13) {
              lVar13 = lVar20;
            }
            if (sVar21 == 0) {
              lVar13 = lVar20;
            }
            sVar21 = sVar21 + 1;
            uVar17 = *(ulong *)(this + 8);
            sVar19 = sVar19 + uVar17;
          } while (sVar21 < *(ulong *)this);
          if (*(ulong *)this == 0) {
            uVar14 = 0;
            uVar18 = 0;
          }
          else {
            lVar20 = *(long *)(this + 0xe8);
            lVar23 = *(long *)(this + 0x10);
            sVar19 = sVar11 + 0x3f;
            if (-1 < (long)sVar11) {
              sVar19 = sVar11;
            }
            lVar6 = ((long)sVar19 >> 6) * 8 + *(long *)(this + 0x38);
            lVar3 = *(long *)(this + 0x60);
            uVar7 = 1L << ((byte)sVar11 & 0x3f);
            lVar1 = (ulong)((sVar11 & 0x800000000000003f) < 0x8000000000000001) * 8 + -8;
            lVar4 = *(long *)(this + 0x88);
            uVar10 = 0;
            sVar19 = sVar11;
            do {
              lVar8 = *(long *)(lVar20 + sVar19 * 8) - lVar13;
              lVar15 = -lVar8;
              if (0 < lVar8) {
                lVar15 = lVar8;
              }
              *(long *)(lVar20 + sVar19 * 8) = lVar15;
              if (lVar15 == *(long *)(this + 0xe0)) {
                uVar17 = sVar19 + 0x3f;
                if (-1 < (long)sVar19) {
                  uVar17 = sVar19;
                }
                uVar18 = (ulong)((sVar19 & 0x800000000000003f) < 0x8000000000000001);
                uVar22 = 1L << ((byte)sVar19 & 0x3f);
                puVar2 = (ulong *)(lVar3 + ((long)uVar17 >> 6) * 8 + -8 + uVar18 * 8);
                *puVar2 = *puVar2 | uVar22;
                uVar14 = uVar10 + 0x3f;
                if (-1 < (long)uVar10) {
                  uVar14 = uVar10;
                }
                uVar16 = (ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001);
                lVar15 = lVar23 + ((long)uVar14 >> 6) * 8;
                if (((*(ulong *)(lVar15 + -8 + uVar16 * 8) >> (uVar10 & 0x3f) & 1) == 0) &&
                   ((*(ulong *)(lVar6 + lVar1) & uVar7) == 0)) {
                  puVar2 = (ulong *)(uVar18 * 8 + -8 + lVar4 + ((long)uVar17 >> 6) * 8);
                  *puVar2 = *puVar2 | uVar22;
                  puVar2 = (ulong *)(lVar15 + uVar16 * 8 + -8);
                  *puVar2 = *puVar2 | 1L << ((byte)uVar10 & 0x3f);
                  puVar2 = (ulong *)(lVar6 + lVar1);
                  *puVar2 = *puVar2 | uVar7;
                }
              }
              uVar10 = uVar10 + 1;
              uVar14 = *(ulong *)this;
              uVar17 = *(ulong *)(this + 8);
              sVar19 = sVar19 + uVar17;
              uVar18 = uVar14;
            } while (uVar10 < uVar14);
          }
        }
        sVar11 = sVar11 + 1;
      } while (sVar11 < uVar17);
    }
  }
  else if (uVar14 == 0) {
    uVar14 = 0;
  }
  else {
    lVar13 = 0;
    sVar11 = 0;
    do {
      if (uVar17 == 0) {
        uVar17 = 0;
      }
      else {
        lVar23 = *(long *)(this + 0xe0);
        lVar20 = lVar13 * 8;
        sVar19 = 0;
        do {
          sVar21 = boost::numeric::ublas::basic_row_major<unsigned_long,_long>::element
                             (sVar11,cost_function->size1_,sVar19,cost_function->size2_);
          pdVar5 = boost::numeric::ublas::
                   unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
                   ::operator[](&cost_function->data_,sVar21);
          lVar1 = pdVar5->rep_;
          *(long *)(*(long *)(this + 0xe8) + lVar13 * 8) = lVar1;
          if (lVar1 < lVar23) {
            lVar23 = lVar1;
          }
          if (sVar19 == 0) {
            lVar23 = lVar1;
          }
          sVar19 = sVar19 + 1;
          lVar13 = lVar13 + 1;
          uVar14 = *(ulong *)(this + 8);
          lVar20 = lVar20 + 8;
        } while (sVar19 < uVar14);
        if (uVar14 == 0) {
          uVar17 = 0;
        }
        else {
          lVar1 = *(long *)(this + 0x38);
          sVar19 = sVar11 + 0x3f;
          if (-1 < (long)sVar11) {
            sVar19 = sVar11;
          }
          lVar15 = ((long)sVar19 >> 6) * 8 + *(long *)(this + 0x10);
          lVar4 = *(long *)(this + 0x60);
          uVar7 = 1L << ((byte)sVar11 & 0x3f);
          lVar3 = (ulong)((sVar11 & 0x800000000000003f) < 0x8000000000000001) * 8 + -8;
          lVar6 = *(long *)(this + 0x88);
          lVar20 = lVar20 + uVar14 * -8 + *(long *)(this + 0xe8);
          uVar18 = 0;
          do {
            lVar9 = *(long *)(lVar20 + uVar18 * 8) - lVar23;
            lVar8 = -lVar9;
            if (0 < lVar9) {
              lVar8 = lVar9;
            }
            *(long *)(lVar20 + uVar18 * 8) = lVar8;
            if (lVar8 == *(long *)(this + 0xe0)) {
              uVar17 = uVar18 + (lVar13 - uVar14);
              uVar10 = uVar17 + 0x3f;
              if (-1 < (long)uVar17) {
                uVar10 = uVar17;
              }
              uVar22 = (ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001);
              uVar17 = 1L << ((byte)uVar17 & 0x3f);
              puVar2 = (ulong *)(lVar4 + ((long)uVar10 >> 6) * 8 + -8 + uVar22 * 8);
              *puVar2 = *puVar2 | uVar17;
              if ((*(ulong *)(lVar15 + lVar3) & uVar7) == 0) {
                uVar16 = uVar18 + 0x3f;
                if (-1 < (long)uVar18) {
                  uVar16 = uVar18;
                }
                uVar12 = (ulong)((uVar18 & 0x800000000000003f) < 0x8000000000000001);
                lVar8 = lVar1 + ((long)uVar16 >> 6) * 8;
                if ((*(ulong *)(lVar8 + -8 + uVar12 * 8) >> (uVar18 & 0x3f) & 1) == 0) {
                  puVar2 = (ulong *)(uVar22 * 8 + -8 + ((long)uVar10 >> 6) * 8 + lVar6);
                  *puVar2 = *puVar2 | uVar17;
                  puVar2 = (ulong *)(lVar15 + lVar3);
                  *puVar2 = *puVar2 | uVar7;
                  puVar2 = (ulong *)(lVar8 + uVar12 * 8 + -8);
                  *puVar2 = *puVar2 | 1L << ((byte)uVar18 & 0x3f);
                }
              }
            }
            uVar18 = uVar18 + 1;
            uVar17 = *(ulong *)(this + 8);
          } while (uVar18 < uVar17);
          lVar13 = (lVar13 - uVar14) + uVar18;
        }
      }
      sVar11 = sVar11 + 1;
      uVar14 = *(ulong *)this;
    } while (sVar11 < uVar14);
  }
  std::vector<bool,_std::allocator<bool>_>::_M_fill_assign
            ((vector<bool,_std::allocator<bool>_> *)(this + 0x10),uVar14,false);
  return;
}

Assistant:

void copyAndNormalizeCosts(const CostFunction& cost_function)
  {
    if (num_rows_ <= num_cols_)
    {
      // Copy costs from cost function and find best cost per row:
      std::size_t i = 0;
      for (std::size_t row = 0; row < num_rows_; ++row)
      {
        Cost best_cost(zero_cost_);
        for (std::size_t col = 0; col < num_cols_; ++col, ++i)
        {
          const Cost cost(cost_function(Size(row), Size(col)));
          cost_matrix_[i] = cost;
          if (col == 0 || cost_comparator_(cost, best_cost))
          {
            best_cost = cost;
          }
        }

        i -= num_cols_; // Reset index to beginning of row

        // Subtract best cost in row from each element (or vice-versa, depending on whether costs are maximized or
        // minimized) and star first zero found in row if column is not already covered:
        for (std::size_t col = 0; col < num_cols_; ++col, ++i)
        {
          Cost& cost = cost_matrix_[i];
          cost = std::max(cost, best_cost) - std::min(cost, best_cost);
          if (cost == zero_cost_)
          {
            zero_matrix_[i] = true;
            if (!covered_rows_[row] && !covered_cols_[col])
            {
              star_matrix_[i] = true;
              covered_rows_[row] = true;
              covered_cols_[col] = true;
            }
          }
        }
      }
    }
    else
    {
      // Copy costs from cost function and find best cost per column:
      for (std::size_t col = 0; col < num_cols_; ++col)
      {
        Cost best_cost(zero_cost_);
        for (std::size_t row = 0, i = col; row < num_rows_; ++row, i += num_cols_)
        {
          const Cost cost(cost_function(Size(row), Size(col)));
          cost_matrix_[i] = cost;
          if (row == 0 || cost_comparator_(cost, best_cost))
          {
            best_cost = cost;
          }
        }

        // Subtract best cost in column from each element (or vice-versa, depending on whether costs are maximized or
        // minimized) and star first zero found in column if column is not already covered:
        for (std::size_t row = 0, i = col; row < num_rows_; ++row, i += num_cols_)
        {
          Cost& cost = cost_matrix_[i];
          cost = std::max(cost, best_cost) - std::min(cost, best_cost);
          if (cost == zero_cost_)
          {
            zero_matrix_[i] = true;
            if (!covered_rows_[row] && !covered_cols_[col])
            {
              star_matrix_[i] = true;
              covered_rows_[row] = true;
              covered_cols_[col] = true;
            }
          }
        }
      }
    }
    covered_rows_.assign(num_rows_, false);
  }